

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::CheckIntensityBinID(ValidateVulnerability *this)

{
  ValidateVulnerability *this_local;
  
  if ((this->v_).intensity_bin_id + -1 != this->prevIntBinID_) {
    fprintf(_stderr,
            "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n",
            (ulong)(uint)this->prevIntBinID_,(ulong)((this->super_Validate).lineno_ - 1),
            (ulong)(uint)(this->v_).intensity_bin_id,(ulong)(uint)(this->super_Validate).lineno_,
            this->prevLine_,&this->super_Validate);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateVulnerability::CheckIntensityBinID() {

  if ((v_.intensity_bin_id - 1) != prevIntBinID_) {

    fprintf(stderr, "ERROR: Non-contiguous intensity bin IDs %d on line %d"
                    " and %d on line %d:\n%s\n%s\n",
            prevIntBinID_, lineno_ - 1, v_.intensity_bin_id, lineno_,
            prevLine_, line_);
    PrintErrorMessage();

  }

}